

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::StatementBlockSymbol::elaborateVariables
          (StatementBlockSymbol *this,function_ref<void_(const_slang::ast::Symbol_&)> insertCB)

{
  SyntaxKind SVar1;
  RsRuleSyntax *syntax;
  undefined8 uVar2;
  bool bVar3;
  Expression *pEVar4;
  intptr_t iVar5;
  SmallVector<const_slang::ast::Symbol_*,_5UL> *__range3;
  _func_void_intptr_t_Symbol_ptr *p_Var6;
  IteratorSymbol *context;
  Symbol *pSVar7;
  long lVar8;
  long lVar9;
  LoopDim *dim;
  pointer pLVar10;
  SmallVector<const_slang::ast::Symbol_*,_5UL> vars;
  undefined1 local_d8 [120];
  undefined1 local_60 [56];
  
  iVar5 = insertCB.callable;
  p_Var6 = insertCB.callback;
  syntax = (RsRuleSyntax *)(this->super_Symbol).originatingSyntax;
  if (syntax == (RsRuleSyntax *)0x0) {
    return;
  }
  SVar1 = (syntax->super_SyntaxNode).kind;
  if (SVar1 == ConditionalPattern) {
    local_60._0_8_ = &this->super_Scope;
    local_60._8_4_ = 0xffffffff;
    local_60._16_8_ = (char *)0x0;
    local_60._24_8_ = (SourceLocation)0x0;
    local_60._32_8_ = (TempVarSymbol *)0x0;
    local_60._40_8_ = (RandomizeDetails *)0x0;
    local_60._48_8_ = (AssertionInstanceDetails *)0x0;
    local_d8._0_8_ = local_d8 + 0x18;
    local_d8._8_8_ = 0;
    local_d8._16_8_ = 5;
    pSVar7 = (Symbol *)(syntax->prods).super_SyntaxListBase._vptr_SyntaxListBase[5];
    bVar3 = Pattern::createPatternVars
                      ((ASTContext *)local_60,(PatternSyntax *)pSVar7,
                       (ExpressionSyntax *)syntax->randJoin,
                       (SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *)local_d8);
    uVar2 = local_d8._0_8_;
    if (!bVar3) {
      this->stmt = (Statement *)InvalidStatement::Instance;
    }
    lVar8 = local_d8._8_8_ << 3;
    for (lVar9 = 0; lVar8 != lVar9; lVar9 = lVar9 + 8) {
      pSVar7 = *(Symbol **)
                ((long)&(((optional<slang::ConstantRange> *)uVar2)->
                        super__Optional_base<slang::ConstantRange,_true,_true>)._M_payload.
                        super__Optional_payload_base<slang::ConstantRange>._M_payload + lVar9);
      (*p_Var6)(iVar5,pSVar7);
    }
  }
  else {
    if (SVar1 == ForeachLoopStatement) {
      local_d8._0_8_ = local_d8 + 0x18;
      local_d8._8_8_ = 0;
      local_d8._16_8_ = 4;
      local_60._0_8_ = &this->super_Scope;
      context = (IteratorSymbol *)local_60;
      local_60._8_4_ = 0xffffffff;
      local_60._16_8_ = (char *)0x0;
      local_60._24_8_ = (SourceLocation)0x0;
      local_60._32_8_ = (TempVarSymbol *)0x0;
      local_60._40_8_ = (RandomizeDetails *)0x0;
      local_60._48_8_ = (AssertionInstanceDetails *)0x0;
      pEVar4 = ForeachLoopStatement::buildLoopDims
                         ((ForeachLoopListSyntax *)syntax[1].super_SyntaxNode.parent,
                          (ASTContext *)context,
                          (SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *)local_d8);
      if (pEVar4 == (Expression *)0x0) {
        this->stmt = (Statement *)InvalidStatement::Instance;
      }
      pLVar10 = (pointer)local_d8._0_8_;
      for (lVar8 = local_d8._8_8_ * 0x18; lVar8 != 0; lVar8 = lVar8 + -0x18) {
        context = pLVar10->loopVar;
        if (context != (IteratorSymbol *)0x0) {
          (*p_Var6)(iVar5,(Symbol *)context);
        }
        pLVar10 = pLVar10 + 1;
      }
      SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::cleanup
                ((SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *)local_d8,
                 (EVP_PKEY_CTX *)context);
      return;
    }
    if (SVar1 != PatternCaseItem) {
      if (SVar1 != RsRule) {
        return;
      }
      local_d8._0_8_ = local_d8 + 0x18;
      local_d8._8_8_ = 0;
      local_d8._16_8_ = 5;
      pSVar7 = (Symbol *)&this->super_Scope;
      RandSeqProductionSymbol::createRuleVariables
                (syntax,(Scope *)pSVar7,(SmallVectorBase<const_slang::ast::Symbol_*> *)local_d8);
      uVar2 = local_d8._0_8_;
      lVar8 = local_d8._8_8_ << 3;
      for (lVar9 = 0; lVar8 != lVar9; lVar9 = lVar9 + 8) {
        pSVar7 = *(Symbol **)
                  ((long)&(((optional<slang::ConstantRange> *)uVar2)->
                          super__Optional_base<slang::ConstantRange,_true,_true>)._M_payload.
                          super__Optional_payload_base<slang::ConstantRange>._M_payload + lVar9);
        (*p_Var6)(iVar5,pSVar7);
      }
      SmallVectorBase<const_slang::ast::Symbol_*>::cleanup
                ((SmallVectorBase<const_slang::ast::Symbol_*> *)local_d8,(EVP_PKEY_CTX *)pSVar7);
      return;
    }
    local_60._0_8_ = &this->super_Scope;
    local_60._8_4_ = 0xffffffff;
    local_60._48_8_ = (AssertionInstanceDetails *)0x0;
    local_60._16_8_ = (char *)0x0;
    local_60._24_8_ = (SourceLocation)0x0;
    local_60._32_8_ = (TempVarSymbol *)0x0;
    local_60._40_8_ = (RandomizeDetails *)0x0;
    local_d8._0_8_ = local_d8 + 0x18;
    local_d8._8_8_ = 0;
    local_d8._16_8_ = 5;
    pSVar7 = (Symbol *)syntax->randJoin;
    bVar3 = Pattern::createPatternVars
                      ((ASTContext *)local_60,(PatternSyntax *)pSVar7,
                       (ExpressionSyntax *)(syntax->super_SyntaxNode).parent[5].previewNode,
                       (SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *)local_d8);
    uVar2 = local_d8._0_8_;
    if (!bVar3) {
      this->stmt = (Statement *)InvalidStatement::Instance;
    }
    lVar8 = local_d8._8_8_ << 3;
    for (lVar9 = 0; lVar8 != lVar9; lVar9 = lVar9 + 8) {
      pSVar7 = *(Symbol **)
                ((long)&(((optional<slang::ConstantRange> *)uVar2)->
                        super__Optional_base<slang::ConstantRange,_true,_true>)._M_payload.
                        super__Optional_payload_base<slang::ConstantRange>._M_payload + lVar9);
      (*p_Var6)(iVar5,pSVar7);
    }
  }
  SmallVectorBase<const_slang::ast::PatternVarSymbol_*>::cleanup
            ((SmallVectorBase<const_slang::ast::PatternVarSymbol_*> *)local_d8,
             (EVP_PKEY_CTX *)pSVar7);
  return;
}

Assistant:

void StatementBlockSymbol::elaborateVariables(function_ref<void(const Symbol&)> insertCB) const {
    SLANG_ASSERT(!stmt);

    auto syntax = getSyntax();
    if (!syntax)
        return;

    if (syntax->kind == SyntaxKind::RsRule) {
        // Create variables to hold results from all non-void productions
        // invoked by this rule.
        SmallVector<const Symbol*> vars;
        RandSeqProductionSymbol::createRuleVariables(syntax->as<RsRuleSyntax>(), *this, vars);
        for (auto var : vars)
            insertCB(*var);
    }
    else if (syntax->kind == SyntaxKind::ForeachLoopStatement) {
        SmallVector<ForeachLoopStatement::LoopDim, 4> dims;
        ASTContext context(*this, LookupLocation::max);

        if (!ForeachLoopStatement::buildLoopDims(*syntax->as<ForeachLoopStatementSyntax>().loopList,
                                                 context, dims)) {
            // If building loop dims failed we don't want to later proceed with trying to
            // bind the statement again, so just set to invalid here.
            stmt = &InvalidStatement::Instance;
        }

        for (auto& dim : dims) {
            if (dim.loopVar)
                insertCB(*dim.loopVar);
        }
    }
    else if (syntax->kind == SyntaxKind::ConditionalPattern) {
        ASTContext context(*this, LookupLocation::max);

        auto& cond = syntax->as<ConditionalPatternSyntax>();
        SLANG_ASSERT(cond.matchesClause);

        SmallVector<const PatternVarSymbol*> vars;
        if (!Pattern::createPatternVars(context, *cond.matchesClause->pattern, *cond.expr, vars))
            stmt = &InvalidStatement::Instance;

        for (auto var : vars)
            insertCB(*var);
    }
    else if (syntax->kind == SyntaxKind::PatternCaseItem) {
        ASTContext context(*this, LookupLocation::max);
        SLANG_ASSERT(syntax->parent);
        auto& caseSyntax = syntax->parent->as<CaseStatementSyntax>();

        SmallVector<const PatternVarSymbol*> vars;
        if (!Pattern::createPatternVars(context, *syntax->as<PatternCaseItemSyntax>().pattern,
                                        *caseSyntax.expr, vars)) {
            stmt = &InvalidStatement::Instance;
        }

        for (auto var : vars)
            insertCB(*var);
    }
}